

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_picnic_test.cpp
# Opt level: O2

void __thiscall
modified_signaturecase::_impl<picnic_params_t>
          (modified_signaturecase *this,anon_enum_32 *parameters)

{
  bool bVar1;
  int iVar2;
  result_type rVar3;
  ulong uVar4;
  long lVar5;
  context_frame context_frame_1590;
  undefined1 local_1628 [16];
  shared_count local_1618;
  char **local_1610;
  size_t max_signature_size;
  value_expr<int> local_15fc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> message;
  vector<unsigned_char,_std::allocator<unsigned_char>_> signature;
  vector<unsigned_char,_std::allocator<unsigned_char>_> signature2;
  size_t signature_len;
  uniform_int_distribution<unsigned_int> dist_pos;
  default_random_engine eng;
  uniform_int_distribution<unsigned_int> dist_diff;
  assertion_result local_1580;
  const_string local_1568;
  char *local_1558;
  char *local_1550;
  const_string local_1548;
  const_string local_1538;
  picnic_privatekey_t sk;
  picnic_publickey_t pk;
  const_string local_1478;
  const_string local_1468;
  const_string local_1458;
  const_string local_1448;
  const_string local_1438;
  const_string local_1428;
  const_string local_1418;
  const_string local_1408;
  const_string local_13f8;
  const_string local_13e8;
  const_string local_13d8;
  const_string local_13c8;
  random_device rnd;
  
  sk.data[8] = '\0';
  sk.data._0_8_ = &PTR__lazy_ostream_00180480;
  sk.data._16_8_ = boost::unit_test::lazy_ostream::inst;
  sk.data._24_8_ = anon_var_dwarf_893fa;
  pk.data._0_8_ = picnic_get_param_name(*parameters);
  rnd.field_0._16_8_ = &sk;
  rnd.field_0.field2[8] = 0;
  rnd.field_0.field_0._M_file = &PTR__lazy_ostream_00182790;
  rnd.field_0._24_8_ = &pk;
  boost::test_tools::tt_detail::context_frame::context_frame
            (&context_frame_1590,(lazy_ostream *)&rnd);
  bVar1 = boost::test_tools::tt_detail::context_frame::operator_cast_to_bool(&context_frame_1590);
  if (bVar1) {
    max_signature_size = picnic_signature_size(*parameters);
    local_13c8.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_13d8.m_begin = "";
    local_13c8.m_end = "";
    local_13d8.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_13c8,0xa1,&local_13d8);
    local_1628._0_8_ = &max_signature_size;
    boost::test_tools::assertion::value_expr<const_unsigned_long_&>::evaluate
              ((assertion_result *)&sk,(value_expr<const_unsigned_long_&> *)local_1628,false);
    pk.data._0_8_ = (long)"siglen <= max_signature_size" + 10;
    rnd.field_0.field2[8] = 0;
    local_13e8.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_13e8.m_end = "";
    pk.data._8_8_ = (long)"siglen <= max_signature_size" + 0x1c;
    rnd.field_0.field_0._M_file = &PTR__lazy_ostream_001827d0;
    rnd.field_0._16_8_ = boost::unit_test::lazy_ostream::inst;
    rnd.field_0._24_8_ = &pk;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&sk,(lazy_ostream *)&rnd,&local_13e8,0xa1,CHECK,
               CHECK_BUILT_ASSERTION,0);
    boost::detail::shared_count::~shared_count((shared_count *)(sk.data + 0x10));
    local_13f8.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_1408.m_begin = "";
    local_13f8.m_end = "";
    local_1408.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_13f8,0xa5,&local_1408);
    iVar2 = picnic_keygen(*parameters,&pk,&sk);
    message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,iVar2 == 0);
    boost::test_tools::assertion::value_expr<bool>::evaluate
              ((assertion_result *)local_1628,(value_expr<bool> *)&message,false);
    rnd.field_0._24_8_ = &signature;
    signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "!picnic_keygen(parameters, &pk, &sk)";
    rnd.field_0.field2[8] = 0;
    local_1418.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_1418.m_end = "";
    signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "";
    rnd.field_0.field_0._M_file = &PTR__lazy_ostream_001827d0;
    rnd.field_0._16_8_ = boost::unit_test::lazy_ostream::inst;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_1628,(lazy_ostream *)&rnd,&local_1418,0xa5,CHECK,
               CHECK_BUILT_ASSERTION,0);
    boost::detail::shared_count::~shared_count(&local_1618);
    message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&signature,max_signature_size);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&message,0x200);
    (anonymous_namespace)::
    randomize_container<std::vector<unsigned_char,std::allocator<unsigned_char>>>(&message);
    local_1428.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_1438.m_begin = "";
    local_1428.m_end = "";
    local_1438.m_end = "";
    signature_len = max_signature_size;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1428,0xb0,&local_1438);
    iVar2 = picnic_sign(&sk,message.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,0x200,
                        signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,&signature_len);
    local_1580.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar2 == 0);
    boost::test_tools::assertion::value_expr<bool>::evaluate
              ((assertion_result *)local_1628,(value_expr<bool> *)&local_1580,false);
    signature2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         "!picnic_sign(&sk, message.data(), message_size, signature.data(), &signature_len)";
    rnd.field_0.field2[8] = 0;
    local_1448.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_1448.m_end = "";
    signature2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "";
    rnd.field_0.field_0._M_file = &PTR__lazy_ostream_001827d0;
    rnd.field_0._16_8_ = boost::unit_test::lazy_ostream::inst;
    rnd.field_0._24_8_ = &signature2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_1628,(lazy_ostream *)&rnd,&local_1448,0xb0,CHECK,
               CHECK_BUILT_ASSERTION,0);
    boost::detail::shared_count::~shared_count(&local_1618);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&signature,signature_len);
    local_1458.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_1468.m_begin = "";
    local_1458.m_end = "";
    local_1468.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1458,0xb3,&local_1468);
    iVar2 = picnic_verify(&pk,message.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,0x200,
                          signature.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)signature.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)signature.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
    local_1580.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar2 == 0);
    boost::test_tools::assertion::value_expr<bool>::evaluate
              ((assertion_result *)local_1628,(value_expr<bool> *)&local_1580,false);
    signature2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         "!picnic_verify(&pk, message.data(), message_size, signature.data(), signature.size())";
    rnd.field_0.field2[8] = 0;
    local_1478.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
    ;
    local_1478.m_end = "";
    signature2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "";
    rnd.field_0.field_0._M_file = &PTR__lazy_ostream_001827d0;
    rnd.field_0._16_8_ = boost::unit_test::lazy_ostream::inst;
    rnd.field_0._24_8_ = &signature2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_1628,(lazy_ostream *)&rnd,&local_1478,0xb3,CHECK,
               CHECK_BUILT_ASSERTION,0);
    boost::detail::shared_count::~shared_count(&local_1618);
    dist_diff._M_param._M_a = 1;
    dist_diff._M_param._M_b = 0xff;
    dist_pos._M_param._M_a = 1;
    dist_pos._M_param._M_b = 0x33262;
    std::random_device::random_device(&rnd);
    uVar4 = std::random_device::_M_getval();
    iVar2 = (int)((uVar4 & 0xffffffff) % 0x7fffffff);
    eng._M_x = (unsigned_long)(iVar2 + (uint)(iVar2 == 0));
    rVar3 = std::uniform_int_distribution<unsigned_int>::operator()(&dist_pos,&eng);
    uVar4 = (ulong)rVar3;
    for (lVar5 = -0x20; lVar5 != 0; lVar5 = lVar5 + 1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &signature2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
                 &signature);
      rVar3 = std::uniform_int_distribution<unsigned_int>::operator()(&dist_diff,&eng);
      signature2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start
      [uVar4 % (ulong)((long)signature2.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)signature2.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start)] =
           signature2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start
           [uVar4 % (ulong)((long)signature2.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)signature2.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start)] + (char)rVar3;
      local_1538.m_begin =
           "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
      ;
      local_1538.m_end = "";
      local_1548.m_begin = "";
      local_1548.m_end = "";
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1538,0xc0,&local_1548
                );
      local_15fc.m_value =
           picnic_verify(&pk,message.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,0x200,
                         signature2.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (long)signature2.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)signature2.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
      boost::test_tools::assertion::value_expr<int>::evaluate(&local_1580,&local_15fc,false);
      local_1628[8] = false;
      local_1568.m_begin =
           "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
      ;
      local_1558 = 
      "picnic_verify(&pk, message.data(), message_size, signature2.data(), signature2.size())";
      local_1550 = "";
      local_1628._0_8_ = &PTR__lazy_ostream_001827d0;
      local_1618.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_1610 = &local_1558;
      local_1568.m_end = "";
      boost::test_tools::tt_detail::report_assertion
                (&local_1580,(lazy_ostream *)local_1628,&local_1568,0xc0,CHECK,CHECK_BUILT_ASSERTION
                 ,0);
      boost::detail::shared_count::~shared_count(&local_1580.m_message.pn);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&signature2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      rVar3 = std::uniform_int_distribution<unsigned_int>::operator()(&dist_pos,&eng);
      uVar4 = uVar4 + rVar3;
    }
    std::random_device::~random_device(&rnd);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&message.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  boost::test_tools::tt_detail::context_frame::~context_frame(&context_frame_1590);
  return;
}

Assistant:

BOOST_DATA_TEST_CASE(modified_signature, all_supported_parameters(), parameters) {
  BOOST_TEST_CONTEXT("Parameter set: " << picnic_get_param_name(parameters)) {
    const size_t max_signature_size = picnic_signature_size(parameters);
    BOOST_TEST(max_signature_size);

    picnic_publickey_t pk;
    picnic_privatekey_t sk;
    BOOST_TEST(!picnic_keygen(parameters, &pk, &sk));

    std::vector<uint8_t> signature, message;
    signature.resize(max_signature_size);

    const size_t message_size = message_inc;
    message.resize(message_size);
    // fill message with some data
    randomize_container(message);

    size_t signature_len = max_signature_size;
    BOOST_TEST(!picnic_sign(&sk, message.data(), message_size, signature.data(), &signature_len));
    signature.resize(signature_len);
    BOOST_TEST(
        !picnic_verify(&pk, message.data(), message_size, signature.data(), signature.size()));

    std::uniform_int_distribution<unsigned int> dist_diff{1, 255};
    std::uniform_int_distribution<unsigned int> dist_pos{1, PICNIC_MAX_SIGNATURE_SIZE};
    std::random_device rnd;
    std::default_random_engine eng{rnd()};

    for (size_t l = dist_pos(eng), rounds = rep; rounds; l += dist_pos(eng), --rounds) {
      std::vector<uint8_t> signature2{signature};
      signature2[l % signature2.size()] += dist_diff(eng);

      // must fail
      BOOST_TEST(
          picnic_verify(&pk, message.data(), message_size, signature2.data(), signature2.size()));
    }
  }
}